

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O0

RC __thiscall
RM_FileHandle::GetPageNumAndSlot(RM_FileHandle *this,RID *rid,PageNum *page,SlotNum *slot)

{
  RC rc;
  SlotNum *slot_local;
  PageNum *page_local;
  RID *rid_local;
  RM_FileHandle *this_local;
  
  this_local._4_4_ = RID::isValidRID(rid);
  if (((this_local._4_4_ == 0) &&
      (this_local._4_4_ = RID::GetPageNum(rid,page), this_local._4_4_ == 0)) &&
     (this_local._4_4_ = RID::GetSlotNum(rid,slot), this_local._4_4_ == 0)) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC RM_FileHandle::GetPageNumAndSlot(const RID &rid, PageNum &page, SlotNum &slot) const {
  RC rc;
  if((rc = rid.isValidRID()))
    return (rc);  
  if((rc = rid.GetPageNum(page)))
    return (rc);
  if((rc = rid.GetSlotNum(slot)))
    return (rc);
  return (0);
}